

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
::find_or_prepare_insert_non_soo<int>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *this,int *key)

{
  ulong uVar1;
  uint uVar2;
  ushort uVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  bool bVar18;
  ushort uVar19;
  ctrl_t *pcVar20;
  ctrl_t *pcVar21;
  slot_type *psVar22;
  ctrl_t *pcVar23;
  size_t sVar24;
  anon_union_8_1_a8a14541_for_iterator_2 aVar25;
  uint uVar26;
  PolicyFunctions *in_R9;
  ulong uVar27;
  size_t cap;
  ulong uVar28;
  ulong uVar29;
  CommonFields *common;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  iterator iVar37;
  FindInfo target;
  __m128i match;
  ctrl_t local_78;
  ctrl_t cStack_77;
  ctrl_t cStack_76;
  ctrl_t cStack_75;
  ctrl_t cVar30;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  
  sVar24 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  if (sVar24 == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>, K = int]"
                 );
  }
  if (sVar24 == 0) {
LAB_0083f757:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>]"
                 );
  }
  prefetch_heap_block(this);
  uVar1 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if ((uVar1 + 1 & uVar1) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar29 = ((ulong)(uint)*key ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13
  ;
  common = (CommonFields *)
           (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
            | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 |
            (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
  uVar27 = ((ulong)common >> 7 ^
           (ulong)(this->settings_).
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control >> 0xc) & uVar1;
  pcVar20 = control(this);
  uVar17 = (undefined1)(uVar29 >> 0x38);
  auVar31 = ZEXT216(CONCAT11(uVar17,uVar17) & 0x7f7f);
  auVar31 = pshuflw(auVar31,auVar31,0);
  iVar37 = __return_storage_ptr__->first;
  bVar18 = __return_storage_ptr__->second;
  uVar29 = 0;
  do {
    aVar25 = iVar37.field_1;
    pcVar21 = iVar37.ctrl_;
    pcVar23 = pcVar20 + uVar27;
    local_78 = *pcVar23;
    cStack_77 = pcVar23[1];
    cStack_76 = pcVar23[2];
    cStack_75 = pcVar23[3];
    uVar16 = *(undefined4 *)pcVar23;
    cVar4 = pcVar23[4];
    cVar5 = pcVar23[5];
    cVar6 = pcVar23[6];
    cVar7 = pcVar23[7];
    cVar8 = pcVar23[8];
    cVar9 = pcVar23[9];
    cVar10 = pcVar23[10];
    cVar11 = pcVar23[0xb];
    cVar12 = pcVar23[0xc];
    cVar13 = pcVar23[0xd];
    cVar14 = pcVar23[0xe];
    cVar15 = pcVar23[0xf];
    cVar30 = auVar31[0];
    auVar32[0] = -(cVar30 == local_78);
    cVar33 = auVar31[1];
    auVar32[1] = -(cVar33 == cStack_77);
    cVar34 = auVar31[2];
    auVar32[2] = -(cVar34 == cStack_76);
    cVar35 = auVar31[3];
    auVar32[3] = -(cVar35 == cStack_75);
    auVar32[4] = -(cVar30 == cVar4);
    auVar32[5] = -(cVar33 == cVar5);
    auVar32[6] = -(cVar34 == cVar6);
    auVar32[7] = -(cVar35 == cVar7);
    auVar32[8] = -(cVar30 == cVar8);
    auVar32[9] = -(cVar33 == cVar9);
    auVar32[10] = -(cVar34 == cVar10);
    auVar32[0xb] = -(cVar35 == cVar11);
    auVar32[0xc] = -(cVar30 == cVar12);
    auVar32[0xd] = -(cVar33 == cVar13);
    auVar32[0xe] = -(cVar34 == cVar14);
    auVar32[0xf] = -(cVar35 == cVar15);
    uVar19 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
    uVar26 = (uint)uVar19;
    while (uVar19 != 0) {
      uVar2 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      psVar22 = slot_array(this);
      uVar28 = uVar2 + uVar27 & uVar1;
      if (psVar22[uVar28].value.first == *key) {
        (__return_storage_ptr__->first).field_1 = aVar25;
        __return_storage_ptr__->second = bVar18;
        (__return_storage_ptr__->first).ctrl_ = pcVar21;
        iVar37 = iterator_at(this,uVar28);
        __return_storage_ptr__->first = iVar37;
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      uVar19 = (ushort)(uVar26 - 1) & (ushort)uVar26;
      uVar26 = CONCAT22((short)(uVar26 - 1 >> 0x10),uVar19);
      local_78 = (ctrl_t)uVar16;
      cStack_77 = (ctrl_t)((uint)uVar16 >> 8);
      cStack_76 = (ctrl_t)((uint)uVar16 >> 0x10);
      cStack_75 = (ctrl_t)((uint)uVar16 >> 0x18);
    }
    auVar36[0] = -(local_78 == kEmpty);
    auVar36[1] = -(cStack_77 == kEmpty);
    auVar36[2] = -(cStack_76 == kEmpty);
    auVar36[3] = -(cStack_75 == kEmpty);
    auVar36[4] = -(cVar4 == kEmpty);
    auVar36[5] = -(cVar5 == kEmpty);
    auVar36[6] = -(cVar6 == kEmpty);
    auVar36[7] = -(cVar7 == kEmpty);
    auVar36[8] = -(cVar8 == kEmpty);
    auVar36[9] = -(cVar9 == kEmpty);
    auVar36[10] = -(cVar10 == kEmpty);
    auVar36[0xb] = -(cVar11 == kEmpty);
    auVar36[0xc] = -(cVar12 == kEmpty);
    auVar36[0xd] = -(cVar13 == kEmpty);
    auVar36[0xe] = -(cVar14 == kEmpty);
    auVar36[0xf] = -(cVar15 == kEmpty);
    uVar19 = (ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe | (ushort)(auVar36[0xf] >> 7) << 0xf;
    sVar24 = (this->settings_).
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    if (uVar19 == 0) {
      if (sVar24 == 0) goto LAB_0083f74c;
      uVar28 = uVar29 + 0x10;
      if (sVar24 < uVar28) {
        (__return_storage_ptr__->first).field_1 = aVar25;
        __return_storage_ptr__->second = bVar18;
        (__return_storage_ptr__->first).ctrl_ = pcVar21;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>, K = int]"
                     );
      }
      uVar27 = uVar27 + uVar29 + 0x10 & uVar1;
    }
    else {
      if (sVar24 == 0) {
LAB_0083f74c:
        (__return_storage_ptr__->first).field_1 = aVar25;
        __return_storage_ptr__->second = bVar18;
        (__return_storage_ptr__->first).ctrl_ = pcVar21;
        goto LAB_0083f757;
      }
      pcVar23 = control(this);
      bVar18 = ShouldInsertBackwardsForDebug(sVar24,(size_t)common,pcVar23);
      if (bVar18) {
        uVar3 = 0xf;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar26 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar26 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
      }
      target.probe_length =
           (size_t)raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>
                   ::GetPolicyFunctions()::value;
      target.offset = uVar29;
      sVar24 = PrepareInsertNonSoo((container_internal *)this,common,uVar26 + uVar27 & uVar1,target,
                                   in_R9);
      iVar37 = iterator_at(this,sVar24);
      bVar18 = true;
      uVar28 = uVar29;
    }
    uVar29 = uVar28;
    if (uVar19 != 0) {
      (__return_storage_ptr__->first).field_1 = iVar37.field_1;
      __return_storage_ptr__->second = bVar18;
      (__return_storage_ptr__->first).ctrl_ = iVar37.ctrl_;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }